

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_util.h
# Opt level: O0

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* anon_unknown.dwarf_47ccc::partition
            (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *str,string *point)

{
  string *psVar1;
  __tuple_element_t<2UL,_tuple<basic_string<char>,_basic_string<char>,_basic_string<char>_>_> *this;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_basic_string<char>,_basic_string<char>_>_>
  *this_00;
  __tuple_element_t<0UL,_tuple<basic_string<char>,_basic_string<char>,_basic_string<char>_>_>
  *this_01;
  string local_50 [32];
  long local_30;
  size_type i;
  string *local_20;
  string *point_local;
  string *str_local;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ret;
  
  i._7_1_ = 0;
  local_20 = point;
  point_local = str;
  str_local = (string *)__return_storage_ptr__;
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::tuple<void,_true>(__return_storage_ptr__);
  local_30 = std::__cxx11::string::find((string *)str,(ulong)local_20);
  if (local_30 != -1) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_50,(ulong)str);
    this = std::get<2ul,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                     (__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)this,local_50);
    std::__cxx11::string::~string(local_50);
    psVar1 = local_20;
    this_00 = std::get<1ul,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                        (__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)this_00,(string *)psVar1);
    std::__cxx11::string::resize((ulong)str);
  }
  this_01 = std::get<0ul,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                      (__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)this_01,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<std::string, std::string, std::string> partition(std::string str, std::string const& point)
	{
		std::tuple<std::string, std::string, std::string> ret;

		auto i = str.find(point);

		if (i == std::string::npos) {
			// no match: string goes in 0th spot only
		} else {
			std::get<2>(ret) = str.substr(i + point.size());
			std::get<1>(ret) = point;
			str.resize(i);
		}
		std::get<0>(ret) = std::move(str);

		return ret;
	}